

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

void __thiscall
testing::internal::
FlatTupleBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_>
::~FlatTupleBase(FlatTupleBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_>
                 *this)

{
  std::__cxx11::string::~string
            ((string *)
             &this->
              super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_5UL>
            );
  std::__cxx11::string::~string
            ((string *)
             &this->
              super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_4UL>
            );
  std::__cxx11::string::~string
            ((string *)
             &this->
              super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_3UL>
            );
  std::__cxx11::string::~string
            ((string *)
             &this->
              super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_2UL>
            );
  std::__cxx11::string::~string
            ((string *)
             &this->
              super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_1UL>
            );
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

FlatTupleBase() = default;